

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

void __thiscall Conn::run(Conn *this)

{
  __pid_t _Var1;
  epoll_event *cur_ev;
  int i;
  
  Epoll::add_event(&this->_epoll,this->_listen_fd,1);
  do {
    do {
      _Var1 = Epoll::wait(&this->_epoll,(void *)0x3e8);
    } while (_Var1 < 1);
    i = 0;
    do {
      cur_ev = Epoll::get(&this->_epoll,i);
      handle(this,cur_ev);
      i = i + 1;
    } while (_Var1 != i);
  } while( true );
}

Assistant:

void Conn::run()
{
    _epoll.add_event(_listen_fd, EPOLLIN);

    while (true)
    {
        int nfds = _epoll.wait(kWaitMS);
        // LOG_PRINT("epoll wait get ready %d fds", nfds);

        for (int i = 0; i < nfds; ++i)
        {
            struct epoll_event &cur_ev = _epoll.get(i);
            handle(cur_ev);
        }
    }
}